

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<64,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  unsigned_long h;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  bool in_stack_0000008b;
  bool in_stack_0000008c;
  bool in_stack_0000008d;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000090;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  byte bVar7;
  undefined4 uVar6;
  Blob<64> *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Blob<64> in_stack_ffffffffffffffd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x40,pcVar4,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x146021);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffffd0);
  memset(&stack0xffffffffffffffd0,0,8);
  if ((local_d & 1) != 0) {
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffffd0,8,0,&stack0xffffffffffffffb8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_ESI),
               (value_type_conflict2 *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<64>,unsigned_long>
            ((pfHash)in_stack_ffffffffffffffd0.bytes,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_ESI));
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_ffffffffffffffb4;
  bVar7 = 1;
  bVar1 = TestHashList<unsigned_long>
                    (in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d,
                     in_stack_0000008c,in_stack_0000008b);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(uVar6,in_ESI));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}